

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_>
::~BuiltinPrecisionCaseTestInstance
          (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_>
           *this)

{
  deInt32 *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ShaderExecutor *pSVar3;
  SharedPtrStateBase *pSVar4;
  pointer pcVar5;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BuiltinPrecisionCaseTestInstance_00d18de8;
  pSVar3 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  if (pSVar3 != (ShaderExecutor *)0x0) {
    (*pSVar3->_vptr_ShaderExecutor[1])();
    (this->m_executor).
    super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    .m_data.ptr = (ShaderExecutor *)0x0;
  }
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state;
  if (pSVar4 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar4->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr = (Statement *)0x0;
      (*((this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state;
      if (pSVar4 != (SharedPtrStateBase *)0x0) {
        (*pSVar4->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>_>_>
  ::~Variables(&this->m_variables);
  pcVar5 = (this->m_caseCtx).name._M_dataplus._M_p;
  paVar2 = &(this->m_caseCtx).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar2) {
    operator_delete(pcVar5,paVar2->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x120);
  return;
}

Assistant:

BuiltinPrecisionCaseTestInstance	(Context&						context,
																		 const CaseContext				caseCtx,
																		 const ShaderSpec&				shaderSpec,
																		 const Variables<In, Out>		variables,
																		 const Samplings<In>&			samplings,
																		 const StatementP				stmt)
										: TestInstance	(context)
										, m_caseCtx		(caseCtx)
										, m_variables	(variables)
										, m_samplings	(samplings)
										, m_stmt		(stmt)
										, m_executor	(createExecutor(context, caseCtx.shaderType, shaderSpec))
									{
									}